

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_client_connection.c
# Opt level: O0

int32_t message_client_connection_create(message_client_connection_t *self,uint8_t addressFamily)

{
  msocket_t *pmVar1;
  undefined1 local_50 [8];
  msocket_handler_t handler;
  uint8_t addressFamily_local;
  message_client_connection_t *self_local;
  
  if (self != (message_client_connection_t *)0x0) {
    self->pendingMessage = (adt_bytearray_t *)0x0;
    handler.tcp_inactivity._7_1_ = addressFamily;
    pmVar1 = (msocket_t *)msocket_new(addressFamily);
    self->msocket = pmVar1;
    if (self->msocket == (msocket_t *)0x0) {
      return 1;
    }
    memset(local_50,0,0x30);
    handler.udp_msg = message_client_connection_onConnect;
    handler.tcp_connected = message_client_connection_onDisconnect;
    msocket_set_handler(self->msocket,local_50,self);
    sem_init((sem_t *)&self->messageTransmitted,0,0);
  }
  return 0;
}

Assistant:

int32_t message_client_connection_create(message_client_connection_t *self, uint8_t addressFamily)
{
   if (self != 0)
   {
      self->pendingMessage = (adt_bytearray_t*) 0;
      self->msocket = msocket_new(addressFamily);
      if (self->msocket == 0)
      {
         return 1;
      }
      else
      {
         msocket_handler_t handler;
         memset(&handler, 0, sizeof(handler));
         handler.tcp_connected = message_client_connection_onConnect;
         handler.tcp_disconnected = message_client_connection_onDisconnect;
         msocket_sethandler(self->msocket, &handler, (void*) self);
         SEMAPHORE_CREATE(self->messageTransmitted);
      }
   }
   return 0;
}